

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O2

FT_UInt pcf_cmap_char_index(FT_CMap pcfcmap,FT_UInt32 charcode)

{
  FT_Face pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pFVar1 = pcfcmap[1].charmap.face;
  uVar4 = (uint)*(ushort *)((long)&pFVar1->num_faces + 4);
  uVar3 = (charcode >> 8) - uVar4;
  uVar2 = 0;
  if (uVar3 < (*(ushort *)((long)&pFVar1->num_faces + 6) - uVar4) + 1) {
    uVar5 = (uint)(ushort)pFVar1->num_faces;
    uVar4 = (charcode & 0xff) - uVar5;
    uVar5 = (*(ushort *)((long)&pFVar1->num_faces + 2) - uVar5) + 1;
    if (uVar4 < uVar5) {
      uVar2 = (uint)*(ushort *)(pFVar1->face_flags + (ulong)(uVar5 * uVar3 + uVar4) * 2);
    }
  }
  return uVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_index( FT_CMap    pcfcmap,  /* PCF_CMap */
                       FT_UInt32  charcode )
  {
    PCF_Enc  enc = ( (PCF_CMap)pcfcmap )->enc;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;


    /* wrapped around "negative" values are also rejected */
    if ( i >= h || j >= w )
      return 0;

    return (FT_UInt)enc->offset[i * w + j];
  }